

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ed.c
# Opt level: O2

void ed_dual_scale(ed *R,limb_t *x,limb_t *y,ed *Q)

{
  limb_t *a_00;
  int iVar1;
  int iVar2;
  ed *peVar3;
  pced *ppVar4;
  bool bVar5;
  fld_t f;
  fld_t a;
  fld_t g;
  fld_t e;
  pced pcQ;
  fld_t h;
  fld_t d;
  fld_t c;
  fld_t b;
  ed QmB;
  ed QpB;
  int uy [261];
  int ux [261];
  limb_t local_b98 [6];
  limb_t local_b68 [6];
  limb_t local_b38 [6];
  limb_t local_b08 [5];
  pced local_ae0;
  limb_t local_a68 [6];
  limb_t local_a38 [6];
  limb_t local_a08 [6];
  limb_t local_9d8 [6];
  ed local_9a8;
  ed local_908;
  int local_868 [264];
  int local_448 [262];
  
  memcpy(R,&ed_zero,0xa0);
  iVar2 = sc_jsf(local_448,local_868,x,y);
  if (iVar2 == -1) {
    return;
  }
  ed_add_pc(&local_908,Q,&pced_B);
  ed_sub_pc(&local_9a8,Q,&pced_B);
  fld_sub(local_ae0.diff,Q->y,Q->x);
  fld_add(local_ae0.sum,Q->y,Q->x);
  fld_mul(local_ae0.prod,Q->t,con_2d);
  a_00 = R->y;
  do {
    iVar1 = local_868[iVar2];
    if (local_448[iVar2] == -1) {
      if (iVar1 == -1) {
        peVar3 = &local_908;
LAB_00102cfd:
        ed_sub(R,R,peVar3);
      }
      else {
        if (iVar1 != 1) {
          ppVar4 = &pced_B;
          goto LAB_00102d3b;
        }
        peVar3 = &local_9a8;
LAB_00102cb5:
        ed_add(R,R,peVar3);
      }
    }
    else {
      if (local_448[iVar2] == 1) {
        if (iVar1 == -1) {
          peVar3 = &local_9a8;
          goto LAB_00102cfd;
        }
        if (iVar1 == 1) {
          peVar3 = &local_908;
          goto LAB_00102cb5;
        }
        ppVar4 = &pced_B;
      }
      else {
        if (iVar1 == -1) {
          ppVar4 = &local_ae0;
LAB_00102d3b:
          ed_sub_pc(R,R,ppVar4);
          goto LAB_00102d40;
        }
        if (iVar1 != 1) goto LAB_00102d40;
        ppVar4 = &local_ae0;
      }
      ed_add_pc(R,R,ppVar4);
    }
LAB_00102d40:
    bVar5 = iVar2 == 0;
    iVar2 = iVar2 + -1;
    if (bVar5) {
      return;
    }
    fld_sub(local_b68,a_00,R->x);
    fld_sq(local_b68,local_b68);
    fld_add(local_9d8,a_00,R->x);
    fld_sq(local_9d8,local_9d8);
    fld_sq(local_a08,R->t);
    fld_mul(local_a08,local_a08,con_2d);
    fld_sq(local_a38,R->z);
    fld_scale2(local_a38,local_a38);
    fld_sub(local_b08,local_9d8,local_b68);
    fld_sub(local_b98,local_a38,local_a08);
    fld_add(local_b38,local_a38,local_a08);
    fld_add(local_a68,local_9d8,local_b68);
    fld_mul(R->x,local_b08,local_b98);
    fld_mul(a_00,local_b38,local_a68);
    fld_mul(R->t,local_b08,local_a68);
    fld_mul(R->z,local_b98,local_b38);
  } while( true );
}

Assistant:

void
ed_dual_scale(struct ed *R,
	      const sc_t x,
	      const sc_t y, const struct ed *Q)
{
	struct ed QpB, QmB;
	struct pced pcQ;

	int ux[SC_BITS+1], uy[SC_BITS+1];
	int n, i;

	memcpy(R, &ed_zero, sizeof(struct ed));

	/* calculate joint sparse form of x and y */
	n = sc_jsf(ux, uy, x, y);
	if (n == -1)
		return;

	/* precompute Q, Q+B and Q-B */
	ed_add_pc(&QpB, Q, &pced_B);
	ed_sub_pc(&QmB, Q, &pced_B);
	ed_precompute(&pcQ, Q);
	
	/* now we calculate R = x * base_point + y * Q using fast shamir method */
	for (i = n; ; i--) {
		if (ux[i] == 1) {
			if (uy[i] == 1)
				ed_add(R, R, &QpB);
			else if (uy[i] == -1)
				ed_sub(R, R, &QmB);
			else
				ed_add_pc(R, R, &pced_B);
			
		} else if (ux[i] == -1) {
			if (uy[i] == 1)
				ed_add(R, R, &QmB);
			else if (uy[i] == -1)
				ed_sub(R, R, &QpB);
			else
				ed_sub_pc(R, R, &pced_B);

		} else {
			if (uy[i] == 1)
				ed_add_pc(R, R, &pcQ);
			else if (uy[i] == -1)
				ed_sub_pc(R, R, &pcQ);
		}

		if (i == 0) break;

		ed_double(R, R);
	}
}